

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::FillUpdateBuffer::Implementation::~Implementation
          (Implementation *this)

{
  pointer puVar1;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_00d01bd8;
  puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const BufferOp bufferOp)
		: m_context		(context)
		, m_resource	(resource)
		, m_fillValue	(0x13)
		, m_bufferOp	(bufferOp)
	{
		DE_ASSERT((m_resource.getBuffer().size % sizeof(deUint32)) == 0);
		DE_ASSERT(m_bufferOp == BUFFER_OP_FILL || m_resource.getBuffer().size <= MAX_UPDATE_BUFFER_SIZE);

		m_data.resize(static_cast<size_t>(m_resource.getBuffer().size));

		if (m_bufferOp == BUFFER_OP_FILL)
		{
			const std::size_t size = m_data.size() / sizeof(m_fillValue);
			deUint32* pData = reinterpret_cast<deUint32*>(&m_data[0]);
			for (deUint32 i = 0; i < size; ++i)
				pData[i] = m_fillValue;
		}
		else if (m_bufferOp == BUFFER_OP_UPDATE)
			fillPattern(&m_data[0], m_data.size());
	}